

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_hash.c
# Opt level: O1

lzma_vli lzma_index_hash_size(lzma_index_hash *index_hash)

{
  lzma_vli lVar1;
  uint32_t uVar2;
  long lVar3;
  
  lVar1 = (index_hash->blocks).index_list_size;
  uVar2 = lzma_vli_size((index_hash->blocks).count);
  lVar3 = (uVar2 + 1) + lVar1;
  if (-1 < lVar3 + 4) {
    return lVar3 + 7U & 0xfffffffffffffffc;
  }
  __assert_fail("vli <= LZMA_VLI_MAX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/common/index.h"
                ,0x29,"lzma_vli vli_ceil4(lzma_vli)");
}

Assistant:

extern LZMA_API(lzma_vli)
lzma_index_hash_size(const lzma_index_hash *index_hash)
{
	// Get the size of the Index from ->blocks instead of ->records for
	// cases where application wants to know the Index Size before
	// decoding the Index.
	return index_size(index_hash->blocks.count,
			index_hash->blocks.index_list_size);
}